

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cpp
# Opt level: O2

int __thiscall sqlite::Connection::Stmt::bind(Stmt *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  int sqlite_error_code;
  Logic_error *this_00;
  char *pcVar1;
  undefined4 in_register_0000000c;
  undefined4 in_register_00000034;
  allocator local_c1;
  string local_c0;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  sqlite_error_code =
       sqlite3_bind_int(this->stmt_,CONCAT44(in_register_00000034,__fd),__addr,
                        CONCAT44(in_register_0000000c,__len));
  if (sqlite_error_code == 0) {
    return sqlite_error_code;
  }
  this_00 = (Logic_error *)__cxa_allocate_exception(0x48);
  std::__cxx11::to_string(&local_a0,__fd);
  std::operator+(&local_80,"Error binding index ",&local_a0);
  std::operator+(&local_60,&local_80,": ");
  pcVar1 = (char *)sqlite3_errmsg(this->db_);
  std::operator+(&local_40,&local_60,pcVar1);
  pcVar1 = (char *)sqlite3_sql(this->stmt_);
  std::__cxx11::string::string((string *)&local_c0,pcVar1,&local_c1);
  Logic_error::Logic_error(this_00,&local_40,&local_c0,sqlite_error_code,this->db_);
  __cxa_throw(this_00,&Logic_error::typeinfo,Logic_error::~Logic_error);
}

Assistant:

void Connection::Stmt::bind(const int index, const int val)
    {
        int status = sqlite3_bind_int(stmt_, index, val);
        if(status != SQLITE_OK)
        {
            throw Logic_error("Error binding index " +
                std::to_string(index) + ": " + sqlite3_errmsg(db_), sqlite3_sql(stmt_), status, db_);
        }
    }